

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult_table_verify(int n,int w)

{
  uint uVar1;
  char *pcVar2;
  undefined8 uStack_10;
  
  if ((n & 1U) == 0) {
    pcVar2 = "test condition failed: ((n) & 1) == 1";
    uStack_10 = 0x78;
  }
  else {
    uVar1 = -1 << ((char)w - 1U & 0x1f);
    if ((int)uVar1 < n) {
      if (n <= (int)~uVar1) {
        return;
      }
      pcVar2 = "test condition failed: (n) <= ((1 << ((w)-1)) - 1)";
      uStack_10 = 0x7a;
    }
    else {
      pcVar2 = "test condition failed: (n) >= -((1 << ((w)-1)) - 1)";
      uStack_10 = 0x79;
    }
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_verify(int n, int w) {
    (void)n;
    (void)w;
    VERIFY_CHECK(((n) & 1) == 1);
    VERIFY_CHECK((n) >= -((1 << ((w)-1)) - 1));
    VERIFY_CHECK((n) <=  ((1 << ((w)-1)) - 1));
}